

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O2

CURLcode gopher_do(connectdata *conn,_Bool *done)

{
  curl_socket_t sockfd;
  Curl_easy *pCVar1;
  CURLcode CVar2;
  int iVar3;
  size_t sVar4;
  size_t len_00;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char *sel;
  char *local_58;
  size_t len;
  ssize_t amount;
  curl_off_t *local_40;
  Curl_easy *local_38;
  
  pCVar1 = conn->data;
  sockfd = conn->sock[0];
  pcVar6 = (pCVar1->state).path;
  sel = (char *)0x0;
  *done = true;
  sVar4 = strlen(pcVar6);
  if (sVar4 < 3) {
    len = 0;
    sel = "";
    local_58 = (char *)0x0;
  }
  else {
    pcVar6 = pcVar6 + 2;
    sVar4 = strlen(pcVar6);
    for (sVar5 = 0; sVar4 != sVar5; sVar5 = sVar5 + 1) {
      if (pcVar6[sVar5] == '?') {
        pcVar6[sVar5] = '\t';
      }
    }
    CVar2 = Curl_urldecode(pCVar1,pcVar6,0,&sel,&len,false);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    local_58 = sel;
  }
  local_40 = &(pCVar1->req).bytecount;
  local_38 = pCVar1;
  len_00 = curlx_uztosz(len);
  while( true ) {
    CVar2 = Curl_write(conn,sockfd,sel,len_00,&amount);
    if ((CVar2 != CURLE_OK) || (CVar2 = Curl_client_write(conn,2,sel,amount), CVar2 != CURLE_OK))
    goto LAB_001350d1;
    sel = sel + amount;
    sVar7 = len_00 - amount;
    if (sVar7 == 0 || (long)len_00 < amount) break;
    iVar3 = Curl_socket_check(-1,-1,sockfd,100);
    len_00 = sVar7;
    if (iVar3 < 0) {
      CVar2 = CURLE_SEND_ERROR;
LAB_001350d1:
      (*Curl_cfree)(local_58);
      pCVar1 = local_38;
      if ((CVar2 == CURLE_OK) && (CVar2 = Curl_sendf(sockfd,conn,"\r\n"), CVar2 == CURLE_OK)) {
        CVar2 = Curl_client_write(conn,2,"\r\n",2);
        if (CVar2 == CURLE_OK) {
          CVar2 = CURLE_OK;
          Curl_setup_transfer(conn,0,-1,false,local_40,-1,(curl_off_t *)0x0);
        }
      }
      else {
        Curl_failf(pCVar1,"Failed sending Gopher request");
      }
      return CVar2;
    }
  }
  CVar2 = CURLE_OK;
  goto LAB_001350d1;
}

Assistant:

static CURLcode gopher_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];

  curl_off_t *bytecount = &data->req.bytecount;
  char *path = data->state.path;
  char *sel = NULL;
  char *sel_org = NULL;
  ssize_t amount, k;
  size_t len;

  *done = TRUE; /* unconditionally */

  /* Create selector. Degenerate cases: / and /1 => convert to "" */
  if(strlen(path) <= 2) {
    sel = (char *)"";
    len = (int)strlen(sel);
  }
  else {
    char *newp;
    size_t j, i;

    /* Otherwise, drop / and the first character (i.e., item type) ... */
    newp = path;
    newp += 2;

    /* ... then turn ? into TAB for search servers, Veronica, etc. ... */
    j = strlen(newp);
    for(i = 0; i<j; i++)
      if(newp[i] == '?')
        newp[i] = '\x09';

    /* ... and finally unescape */
    result = Curl_urldecode(data, newp, 0, &sel, &len, FALSE);
    if(result)
      return result;
    sel_org = sel;
  }

  /* We use Curl_write instead of Curl_sendf to make sure the entire buffer is
     sent, which could be sizeable with long selectors. */
  k = curlx_uztosz(len);

  for(;;) {
    result = Curl_write(conn, sockfd, sel, k, &amount);
    if(!result) { /* Which may not have written it all! */
      result = Curl_client_write(conn, CLIENTWRITE_HEADER, sel, amount);
      if(result)
        break;

      k -= amount;
      sel += amount;
      if(k < 1)
        break; /* but it did write it all */
    }
    else
      break;

    /* Don't busyloop. The entire loop thing is a work-around as it causes a
       BLOCKING behavior which is a NO-NO. This function should rather be
       split up in a do and a doing piece where the pieces that aren't
       possible to send now will be sent in the doing function repeatedly
       until the entire request is sent.

       Wait a while for the socket to be writable. Note that this doesn't
       acknowledge the timeout.
    */
    if(SOCKET_WRITABLE(sockfd, 100) < 0) {
      result = CURLE_SEND_ERROR;
      break;
    }
  }

  free(sel_org);

  if(!result)
    /* We can use Curl_sendf to send the terminal \r\n relatively safely and
       save allocing another string/doing another _write loop. */
    result = Curl_sendf(sockfd, conn, "\r\n");
  if(result) {
    failf(data, "Failed sending Gopher request");
    return result;
  }
  result = Curl_client_write(conn, CLIENTWRITE_HEADER, (char *)"\r\n", 2);
  if(result)
    return result;

  Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount,
                      -1, NULL); /* no upload */
  return CURLE_OK;
}